

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O2

bool_t ec2IsValid(ec_o *ec,void *stack)

{
  bool_t bVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  bVar1 = ecIsOperable2(ec);
  uVar4 = 0;
  if (((bVar1 != 0) && (bVar1 = gf2IsValid(ec->f,stack), bVar1 != 0)) && (ec->f->deep <= ec->deep))
  {
    sVar3 = gf2Deg(ec->f);
    if (((sVar3 & 0x3f) != 0) && (iVar2 = wwCmp(ec->A,ec->f->mod,ec->f->n), -1 < iVar2)) {
      return 0;
    }
    sVar3 = gf2Deg(ec->f);
    if (((sVar3 & 0x3f) != 0) && (iVar2 = wwCmp(ec->B,ec->f->mod,ec->f->n), -1 < iVar2)) {
      return 0;
    }
    bVar1 = wwIsZero(ec->B,ec->f->n);
    uVar4 = (uint)(bVar1 == 0);
  }
  return uVar4;
}

Assistant:

bool_t ec2IsValid(const ec_o* ec, void* stack)
{
	// кривая работоспособна? поле ec->f корректно?
	// ec->deep >= ec->f->deep?
	// A, B \in ec->f, B != 0?
	return ecIsOperable2(ec) &&
		gf2IsValid(ec->f, stack) &&
		ec->deep >= ec->f->deep &&
		gf2IsIn(ec->A, ec->f) &&
		gf2IsIn(ec->B, ec->f) &&
		!qrIsZero(ec->B, ec->f);
}